

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void ly_ctx_clean(ly_ctx *ctx,_func_void_lys_node_ptr_void_ptr *private_destructor)

{
  uint16_t *puVar1;
  int iVar2;
  uint uVar3;
  
  if (ctx != (ly_ctx *)0x0) {
    uVar3 = (ctx->models).used;
    while ((int)(uint)ctx->internal_module_count < (int)uVar3) {
      lys_sub_module_remove_devs_augs((ctx->models).list[(ulong)uVar3 - 1]);
      lys_free((ctx->models).list[(long)(ctx->models).used + -1],private_destructor,1,0);
      iVar2 = (ctx->models).used;
      (ctx->models).list[(long)iVar2 + -1] = (lys_module *)0x0;
      uVar3 = iVar2 - 1;
      (ctx->models).used = uVar3;
    }
    puVar1 = &(ctx->models).module_set_id;
    *puVar1 = *puVar1 + 1;
    ctx_modules_undo_backlinks(ctx,(ly_set *)0x0);
    return;
  }
  return;
}

Assistant:

API void
ly_ctx_clean(struct ly_ctx *ctx, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    if (!ctx) {
        return;
    }

    /* models list */
    for (; ctx->models.used > ctx->internal_module_count; ctx->models.used--) {
        /* remove the applied deviations and augments */
        lys_sub_module_remove_devs_augs(ctx->models.list[ctx->models.used - 1]);
        /* remove the module */
        lys_free(ctx->models.list[ctx->models.used - 1], private_destructor, 1, 0);
        /* clean it for safer future use */
        ctx->models.list[ctx->models.used - 1] = NULL;
    }
    ctx->models.module_set_id++;

    /* maintain backlinks (actually done only with ietf-yang-library since its leafs can be target of leafref) */
    ctx_modules_undo_backlinks(ctx, NULL);
}